

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_cr.c
# Opt level: O0

void byte_copyr(char *to,uint n,char *from)

{
  char *local_20;
  char *from_local;
  char *pcStack_10;
  uint n_local;
  char *to_local;
  
  local_20 = from + n;
  pcStack_10 = to + n;
  for (from_local._4_4_ = n;
      (((from_local._4_4_ != 0 && (pcStack_10[-1] = local_20[-1], from_local._4_4_ != 1)) &&
       (pcStack_10[-2] = local_20[-2], from_local._4_4_ != 2)) &&
      (pcStack_10[-3] = local_20[-3], from_local._4_4_ != 3));
      from_local._4_4_ = from_local._4_4_ - 4) {
    pcStack_10[-4] = local_20[-4];
    local_20 = local_20 + -4;
    pcStack_10 = pcStack_10 + -4;
  }
  return;
}

Assistant:

void byte_copyr(to,n,from)
register char *to;
register unsigned int n;
register char *from;
{
  to += n;
  from += n;
  for (;;) {
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
    if (!n) return; *--to = *--from; --n;
  }
}